

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
clique_t::clique_t(clique_t *this,vector<long,_std::allocator<long>_> *_vertices,index_t _loc)

{
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices,_vertices);
  this->location = _loc;
  (this->cofaces)._M_h._M_buckets = &(this->cofaces)._M_h._M_single_bucket;
  (this->cofaces)._M_h._M_bucket_count = 1;
  (this->cofaces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cofaces)._M_h._M_element_count = 0;
  (this->cofaces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cofaces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cofaces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

clique_t(std::vector<index_t> _vertices, index_t _loc)  : vertices(_vertices), location(_loc) {}